

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

void __thiscall HydEngine::~HydEngine(HydEngine *this)

{
  int in_ESI;
  HydEngine *this_local;
  
  close(this,in_ESI);
  std::__cxx11::string::~string((string *)&this->timeStepReason);
  return;
}

Assistant:

HydEngine::~HydEngine()
{
    close();

//    cout << "\nHydEngine destructed.\n";
}